

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

void __thiscall deqp::egl::GLES2ThreadTest::GLES2Context::~GLES2Context(GLES2Context *this)

{
  GLES2Context *this_local;
  
  ~GLES2Context(this);
  operator_delete(this,0x60);
  return;
}

Assistant:

GLES2Context::~GLES2Context (void)
{
}